

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int luaL_loadfilex(lua_State *L,char *filename,char *mode)

{
  int iVar1;
  int iVar2;
  char *chunkname;
  int local_2044;
  int fnameindex;
  int c;
  int readstatus;
  int status;
  LoadF lf;
  char *mode_local;
  char *filename_local;
  lua_State *L_local;
  
  lf.buff._8184_8_ = mode;
  iVar1 = lua_gettop(L);
  iVar1 = iVar1 + 1;
  if (filename == (char *)0x0) {
    lua_pushstring(L,"=stdin");
    lf.n = _stdin;
    lf._4_4_ = stdin_4;
  }
  else {
    lua_pushfstring(L,"@%s",filename);
    lf._0_8_ = fopen64(filename,"r");
    if ((FILE *)lf._0_8_ == (FILE *)0x0) {
      iVar1 = errfile(L,"open",iVar1);
      return iVar1;
    }
  }
  iVar2 = skipcomment((LoadF *)&readstatus,&local_2044);
  if (iVar2 != 0) {
    lf.buff[(long)readstatus + -8] = '\n';
    readstatus = readstatus + 1;
  }
  if ((local_2044 == 0x1b) && (filename != (char *)0x0)) {
    lf._0_8_ = freopen64(filename,"rb",(FILE *)lf._0_8_);
    if ((FILE *)lf._0_8_ == (FILE *)0x0) {
      iVar1 = errfile(L,"reopen",iVar1);
      return iVar1;
    }
    skipcomment((LoadF *)&readstatus,&local_2044);
  }
  if (local_2044 != -1) {
    lf.buff[(long)readstatus + -8] = (char)local_2044;
    readstatus = readstatus + 1;
  }
  chunkname = lua_tolstring(L,-1,(size_t *)0x0);
  c = lua_load(L,getF,&readstatus,chunkname,(char *)lf.buff._8184_8_);
  fnameindex = ferror((FILE *)lf._0_8_);
  if (filename != (char *)0x0) {
    fclose((FILE *)lf._0_8_);
  }
  if (fnameindex == 0) {
    lua_rotate(L,iVar1,-1);
    lua_settop(L,-2);
    L_local._4_4_ = c;
  }
  else {
    lua_settop(L,iVar1);
    L_local._4_4_ = errfile(L,"read",iVar1);
  }
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_loadfilex(lua_State *L, const char *filename,
                              const char *mode) {
    LoadF lf;
    int status, readstatus;
    int c;
    int fnameindex = lua_gettop(L) + 1;  /* index of filename on the stack */
    if (filename == NULL) {
        lua_pushliteral(L, "=stdin");
        lf.f = stdin;
    } else {
        lua_pushfstring(L, "@%s", filename);
        lf.f = fopen(filename, "r");
        if (lf.f == NULL) return errfile(L, "open", fnameindex);
    }
    if (skipcomment(&lf, &c))  /* read initial portion */
        lf.buff[lf.n++] = '\n';  /* add line to correct line numbers */
    if (c == LUA_SIGNATURE[0] && filename) {  /* binary file? */
        lf.f = freopen(filename, "rb", lf.f);  /* reopen in binary mode */
        if (lf.f == NULL) return errfile(L, "reopen", fnameindex);
        skipcomment(&lf, &c);  /* re-read initial portion */
    }
    if (c != EOF)
        lf.buff[lf.n++] = c;  /* 'c' is the first character of the stream */
    status = lua_load(L, getF, &lf, lua_tostring(L, -1), mode);
    readstatus = ferror(lf.f);
    if (filename) fclose(lf.f);  /* close file (even in case of errors) */
    if (readstatus) {
        lua_settop(L, fnameindex);  /* ignore results from 'lua_load' */
        return errfile(L, "read", fnameindex);
    }
    lua_remove(L, fnameindex);
    return status;
}